

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogicOperatorType.cpp
# Opt level: O0

string * __thiscall
IRT::ToString_abi_cxx11_(string *__return_storage_ptr__,IRT *this,LogicOperatorType type)

{
  string *this_00;
  undefined7 in_register_00000011;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [19];
  allocator<char> local_12;
  undefined1 local_11;
  string *psStack_10;
  LogicOperatorType type_local;
  
  local_11 = SUB81(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"LT",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GT",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"EQ",&local_12);
    std::allocator<char>::~allocator(&local_12);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NE",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  default:
    this_00 = (string *)__cxa_allocate_exception(0x20,this,CONCAT71(in_register_00000011,type));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,"unknown logic operator type",&local_28);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IRT::ToString(IRT::LogicOperatorType type) {
  switch (type) {
    case LogicOperatorType::EQ:
      return "EQ";
    case LogicOperatorType::NE:
      return "NE";
    case LogicOperatorType::LT:
      return "LT";
    case LogicOperatorType::GT:
      return "GT";
  }
  throw std::string("unknown logic operator type");
}